

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_fma.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_b<ncnn::BinaryOp_x86_fma_functor::binary_op_ratan2>
               (float *ptr,float *ptr1,float *outptr,int size,int elempack)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  int in_ECX;
  float *in_RDX;
  float *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  float fVar78;
  undefined1 auVar79 [32];
  __m128 _outp_1;
  __m128 _p_1;
  __m256 _outp;
  __m256 _p;
  __m256 _b_256;
  __m128 _b_128;
  int i;
  float b;
  binary_op_ratan2 op;
  __m256 special_result;
  __m256 negative_mask_full_x;
  __m256 normal_result;
  __m256 pi_additions;
  __m256 negative_mask_y;
  __m256 negative_mask_x;
  __m256 normal_mode;
  __m256 not_equal_zero_y;
  __m256 not_equal_zero_x;
  __m256 magic_half_pi;
  __m256 magic_pi;
  __m256 magic_negative_zero;
  __m256 magic_zero;
  __m256 output_approx;
  __m256 fourth_power_of_input_approx;
  __m256 square_of_input_approx;
  __m256 input_approx;
  __m256 is_small_input;
  __m256 absolute;
  __m256 negative_mask;
  __m256 magic_a8;
  __m256 magic_a7;
  __m256 magic_a6;
  __m256 magic_a5;
  __m256 magic_a4;
  __m256 magic_a3;
  __m256 magic_a2;
  __m256 magic_a1;
  __m256 magic_a0;
  __m256 magic_half_pi_1;
  __m256 magic_negative_one;
  __m256 magic_one;
  __m256 magic_negative_zero_1;
  __m128 special_result_1;
  __m128 negative_mask_full_x_1;
  __m128 normal_result_1;
  __m128 pi_additions_1;
  __m128 negative_mask_y_1;
  __m128 negative_mask_x_1;
  __m128 normal_mode_1;
  __m128 not_equal_zero_y_1;
  __m128 not_equal_zero_x_1;
  __m128 magic_half_pi_2;
  __m128 magic_pi_1;
  __m128 magic_negative_zero_2;
  __m128 magic_zero_1;
  __m128 output_approx_1;
  __m128 fourth_power_of_input_approx_1;
  __m128 square_of_input_approx_1;
  __m128 input_approx_1;
  __m128 is_small_input_1;
  __m128 absolute_1;
  __m128 negative_mask_1;
  __m128 magic_a8_1;
  __m128 magic_a7_1;
  __m128 magic_a6_1;
  __m128 magic_a5_1;
  __m128 magic_a4_1;
  __m128 magic_a3_1;
  __m128 magic_a2_1;
  __m128 magic_a1_1;
  __m128 magic_a0_1;
  __m128 magic_half_pi_3;
  __m128 magic_negative_one_1;
  __m128 magic_one_1;
  __m128 magic_negative_zero_3;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 local_2490;
  undefined8 uStack_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 local_2470;
  undefined8 uStack_2468;
  undefined1 local_2460 [32];
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 local_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  undefined8 local_23f0;
  undefined8 uStack_23e8;
  int local_23dc;
  float local_23d8;
  undefined1 local_23d1 [5];
  int local_23cc;
  float *local_23c8;
  undefined1 (*local_23b8) [32];
  undefined1 (*local_23b0) [32];
  undefined8 local_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  float *local_2368;
  undefined1 (*local_2360) [32];
  undefined8 local_2350;
  undefined8 uStack_2348;
  float *local_2338;
  float local_2330;
  float fStack_232c;
  float fStack_2328;
  float fStack_2324;
  float local_2314;
  undefined8 local_2310;
  undefined8 uStack_2308;
  undefined8 *local_22f8;
  undefined8 *local_22f0;
  undefined1 *local_22e8;
  undefined1 local_22e0 [32];
  undefined1 local_22c0 [32];
  float local_22a0;
  float fStack_229c;
  float fStack_2298;
  float fStack_2294;
  float fStack_2290;
  float fStack_228c;
  float fStack_2288;
  float fStack_2284;
  undefined1 local_2280 [32];
  undefined1 local_2260 [32];
  undefined1 local_2240 [32];
  undefined1 local_2220 [32];
  undefined1 local_2200 [32];
  undefined1 local_21e0 [32];
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 local_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  undefined8 local_2160;
  undefined8 uStack_2158;
  undefined8 uStack_2150;
  undefined8 uStack_2148;
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 local_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined1 local_20e0 [8];
  float fStack_20d8;
  float fStack_20d4;
  float fStack_20d0;
  float fStack_20cc;
  float fStack_20c8;
  float fStack_20c4;
  undefined4 local_20b0;
  undefined4 local_20ac;
  undefined4 local_20a8;
  undefined4 local_20a4;
  undefined1 local_20a0 [16];
  undefined1 auStack_2090 [16];
  undefined4 local_2080;
  undefined4 local_207c;
  undefined4 local_2078;
  undefined4 local_2074;
  undefined4 local_2070;
  undefined4 local_206c;
  undefined4 local_2068;
  undefined4 local_2064;
  undefined1 local_2060 [16];
  undefined1 auStack_2050 [16];
  undefined4 local_2040;
  undefined4 local_203c;
  undefined4 local_2038;
  undefined4 local_2034;
  undefined4 local_2030;
  undefined4 local_202c;
  undefined4 local_2028;
  undefined4 local_2024;
  undefined1 local_2020 [16];
  undefined1 auStack_2010 [16];
  undefined4 local_2000;
  undefined4 local_1ffc;
  undefined4 local_1ff8;
  undefined4 local_1ff4;
  undefined4 local_1ff0;
  undefined4 local_1fec;
  undefined4 local_1fe8;
  undefined4 local_1fe4;
  undefined1 local_1fe0 [16];
  undefined1 auStack_1fd0 [16];
  undefined4 local_1fc0;
  undefined4 local_1fbc;
  undefined4 local_1fb8;
  undefined4 local_1fb4;
  undefined4 local_1fb0;
  undefined4 local_1fac;
  undefined4 local_1fa8;
  undefined4 local_1fa4;
  undefined8 local_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined1 local_1ee0 [32];
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined1 local_1ea0 [32];
  undefined1 local_1e80 [32];
  undefined8 local_1e60;
  undefined8 uStack_1e58;
  undefined8 uStack_1e50;
  undefined8 uStack_1e48;
  undefined1 local_1e40 [32];
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined1 local_1d60 [32];
  undefined1 local_1d40 [32];
  undefined1 local_1d20 [32];
  undefined1 local_1d00 [32];
  undefined1 local_1ce0 [32];
  undefined1 local_1cc0 [32];
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined1 local_1c00 [32];
  undefined1 local_1be0 [32];
  undefined1 local_1bc0 [32];
  undefined1 local_1ba0 [32];
  undefined1 local_1b80 [32];
  undefined1 local_1b60 [32];
  undefined1 local_1b40 [32];
  undefined1 local_1b20 [32];
  undefined1 local_1b00 [32];
  float local_1ae0;
  float fStack_1adc;
  float fStack_1ad8;
  float fStack_1ad4;
  float fStack_1ad0;
  float fStack_1acc;
  float fStack_1ac8;
  float fStack_1ac4;
  float local_1ac0;
  float fStack_1abc;
  float fStack_1ab8;
  float fStack_1ab4;
  float fStack_1ab0;
  float fStack_1aac;
  float fStack_1aa8;
  float fStack_1aa4;
  undefined1 local_1aa0 [32];
  undefined1 local_1a80 [32];
  undefined1 local_1a60 [32];
  undefined1 local_1a40 [32];
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined1 local_1880 [32];
  undefined1 local_1860 [8];
  float fStack_1858;
  float fStack_1854;
  float fStack_1850;
  float fStack_184c;
  float fStack_1848;
  float fStack_1844;
  float local_1840;
  float fStack_183c;
  float fStack_1838;
  float fStack_1834;
  float fStack_1830;
  float fStack_182c;
  float fStack_1828;
  float fStack_1824;
  undefined4 local_1814;
  undefined4 local_1810;
  undefined4 local_180c;
  undefined4 local_1808;
  undefined4 local_1804;
  undefined4 local_1800;
  undefined4 local_17fc;
  undefined4 local_17f8;
  undefined4 local_17f4;
  undefined4 local_17f0;
  undefined4 local_17ec;
  undefined4 local_17e8;
  undefined4 local_17e4;
  undefined1 local_17e0 [16];
  undefined1 auStack_17d0 [16];
  undefined4 local_17c0;
  undefined4 local_17bc;
  undefined4 local_17b8;
  undefined4 local_17b4;
  undefined4 local_17b0;
  undefined4 local_17ac;
  undefined4 local_17a8;
  undefined4 local_17a4;
  undefined1 local_17a0 [16];
  undefined1 auStack_1790 [16];
  undefined4 local_1780;
  undefined4 local_177c;
  undefined4 local_1778;
  undefined4 local_1774;
  undefined4 local_1770;
  undefined4 local_176c;
  undefined4 local_1768;
  undefined4 local_1764;
  undefined1 local_1760 [16];
  undefined1 auStack_1750 [16];
  undefined4 local_1740;
  undefined4 local_173c;
  undefined4 local_1738;
  undefined4 local_1734;
  undefined4 local_1730;
  undefined4 local_172c;
  undefined4 local_1728;
  undefined4 local_1724;
  undefined1 local_1720 [16];
  undefined1 auStack_1710 [16];
  undefined4 local_1700;
  undefined4 local_16fc;
  undefined4 local_16f8;
  undefined4 local_16f4;
  undefined4 local_16f0;
  undefined4 local_16ec;
  undefined4 local_16e8;
  undefined4 local_16e4;
  undefined1 local_16e0 [16];
  undefined1 auStack_16d0 [16];
  undefined4 local_16c0;
  undefined4 local_16bc;
  undefined4 local_16b8;
  undefined4 local_16b4;
  undefined4 local_16b0;
  undefined4 local_16ac;
  undefined4 local_16a8;
  undefined4 local_16a4;
  undefined1 local_16a0 [16];
  undefined1 auStack_1690 [16];
  undefined4 local_1680;
  undefined4 local_167c;
  undefined4 local_1678;
  undefined4 local_1674;
  undefined4 local_1670;
  undefined4 local_166c;
  undefined4 local_1668;
  undefined4 local_1664;
  undefined1 local_1660 [16];
  undefined1 auStack_1650 [16];
  undefined4 local_1640;
  undefined4 local_163c;
  undefined4 local_1638;
  undefined4 local_1634;
  undefined4 local_1630;
  undefined4 local_162c;
  undefined4 local_1628;
  undefined4 local_1624;
  undefined1 local_1620 [16];
  undefined1 auStack_1610 [16];
  undefined4 local_1600;
  undefined4 local_15fc;
  undefined4 local_15f8;
  undefined4 local_15f4;
  undefined4 local_15f0;
  undefined4 local_15ec;
  undefined4 local_15e8;
  undefined4 local_15e4;
  undefined1 local_15e0 [16];
  undefined1 auStack_15d0 [16];
  undefined4 local_15c0;
  undefined4 local_15bc;
  undefined4 local_15b8;
  undefined4 local_15b4;
  undefined4 local_15b0;
  undefined4 local_15ac;
  undefined4 local_15a8;
  undefined4 local_15a4;
  undefined1 local_15a0 [16];
  undefined1 auStack_1590 [16];
  undefined4 local_1580;
  undefined4 local_157c;
  undefined4 local_1578;
  undefined4 local_1574;
  undefined4 local_1570;
  undefined4 local_156c;
  undefined4 local_1568;
  undefined4 local_1564;
  undefined1 local_1560 [16];
  undefined1 auStack_1550 [16];
  undefined4 local_1540;
  undefined4 local_153c;
  undefined4 local_1538;
  undefined4 local_1534;
  undefined4 local_1530;
  undefined4 local_152c;
  undefined4 local_1528;
  undefined4 local_1524;
  undefined1 local_1520 [16];
  undefined1 auStack_1510 [16];
  undefined4 local_1500;
  undefined4 local_14fc;
  undefined4 local_14f8;
  undefined4 local_14f4;
  undefined4 local_14f0;
  undefined4 local_14ec;
  undefined4 local_14e8;
  undefined4 local_14e4;
  undefined1 local_14e0 [16];
  undefined1 auStack_14d0 [16];
  undefined4 local_14c0;
  undefined4 local_14bc;
  undefined4 local_14b8;
  undefined4 local_14b4;
  undefined4 local_14b0;
  undefined4 local_14ac;
  undefined4 local_14a8;
  undefined4 local_14a4;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined1 local_13e0 [32];
  undefined1 local_13c0 [32];
  undefined1 *local_13a0;
  undefined1 *local_1398;
  float *local_1390;
  undefined8 *local_1388;
  undefined1 *local_1380;
  float *local_1378;
  undefined8 *local_1370;
  undefined1 *local_1368;
  float *local_1360;
  undefined8 *local_1358;
  undefined1 *local_1350;
  float *local_1348;
  undefined8 *local_1340;
  undefined8 *local_1338;
  float *local_1330;
  undefined8 *local_1328;
  undefined1 *local_1320;
  float *local_1318;
  undefined8 *local_1310;
  undefined1 *local_1308;
  float *local_1300;
  undefined8 *local_12f8;
  undefined8 *local_12f0;
  float *local_12e8;
  undefined8 local_12e0;
  undefined8 uStack_12d8;
  undefined8 uStack_12d0;
  undefined8 uStack_12c8;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 uStack_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 uStack_1250;
  undefined8 uStack_1248;
  undefined8 local_1240;
  undefined8 uStack_1238;
  undefined8 uStack_1230;
  undefined8 uStack_1228;
  undefined8 local_1220;
  undefined8 uStack_1218;
  undefined8 uStack_1210;
  undefined8 uStack_1208;
  undefined8 local_1200;
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  undefined8 local_11e0;
  undefined8 uStack_11d8;
  undefined8 uStack_11d0;
  undefined8 uStack_11c8;
  undefined8 local_11c0;
  undefined8 uStack_11b8;
  undefined8 uStack_11b0;
  undefined8 uStack_11a8;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  float local_ec0;
  float fStack_ebc;
  float fStack_eb8;
  float fStack_eb4;
  float fStack_eb0;
  float fStack_eac;
  float fStack_ea8;
  float fStack_ea4;
  undefined1 local_ea0 [32];
  undefined1 local_e80 [32];
  undefined1 local_e60 [32];
  undefined1 local_e40 [32];
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined1 local_d20 [32];
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 *local_c98;
  undefined8 *local_c90;
  undefined1 *local_c88;
  undefined1 local_c80 [16];
  undefined1 local_c70 [16];
  float local_c60;
  float fStack_c5c;
  float fStack_c58;
  float fStack_c54;
  undefined1 local_c50 [16];
  undefined1 local_c40 [16];
  undefined1 local_c30 [16];
  undefined1 local_c20 [16];
  undefined1 local_c10 [16];
  undefined1 local_c00 [16];
  undefined8 local_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 local_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 local_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 local_b90;
  undefined8 uStack_b88;
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  undefined8 local_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 local_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 local_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined1 local_b10 [16];
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined1 local_af0 [16];
  undefined1 local_ae0 [16];
  undefined8 local_ad0;
  undefined8 uStack_ac8;
  undefined1 local_ac0 [16];
  undefined8 local_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 local_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 local_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined1 local_a50 [16];
  undefined1 local_a40 [16];
  undefined1 local_a30 [16];
  undefined1 local_a20 [16];
  undefined1 local_a10 [16];
  undefined1 local_a00 [16];
  undefined8 local_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined1 local_9a0 [16];
  undefined8 local_990;
  undefined8 uStack_988;
  undefined1 local_980 [16];
  undefined8 local_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 local_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined4 local_924;
  undefined4 local_920;
  undefined4 uStack_91c;
  undefined4 uStack_918;
  undefined4 uStack_914;
  undefined4 local_908;
  undefined4 local_904;
  undefined4 local_900;
  undefined4 uStack_8fc;
  undefined4 uStack_8f8;
  undefined4 uStack_8f4;
  undefined4 local_8e8;
  undefined4 local_8e4;
  undefined4 local_8e0;
  undefined4 uStack_8dc;
  undefined4 uStack_8d8;
  undefined4 uStack_8d4;
  undefined4 local_8c8;
  undefined4 local_8c4;
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 local_8a4;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 local_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 local_870;
  undefined8 uStack_868;
  undefined1 local_860 [16];
  undefined1 local_850 [16];
  undefined1 local_840 [16];
  undefined1 local_830 [16];
  undefined1 local_820 [16];
  undefined1 local_810 [16];
  undefined1 local_800 [16];
  undefined1 local_7f0 [16];
  float local_7e0;
  float fStack_7dc;
  float fStack_7d8;
  float fStack_7d4;
  float local_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [16];
  undefined1 local_7b0 [16];
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float local_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 local_630;
  undefined8 uStack_628;
  undefined1 local_620 [16];
  undefined1 local_610 [16];
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 local_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 local_590;
  undefined8 uStack_588;
  undefined1 *local_580;
  undefined1 *local_578;
  float *local_570;
  undefined8 *local_568;
  undefined1 *local_560;
  float *local_558;
  undefined8 *local_550;
  undefined1 *local_548;
  float *local_540;
  undefined8 *local_538;
  undefined1 *local_530;
  float *local_528;
  undefined8 *local_520;
  undefined8 *local_518;
  float *local_510;
  undefined8 *local_508;
  undefined1 *local_500;
  float *local_4f8;
  undefined8 *local_4f0;
  undefined1 *local_4e8;
  float *local_4e0;
  undefined8 *local_4d8;
  undefined8 *local_4d0;
  float *local_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 local_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  float local_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [16];
  undefined1 local_310 [16];
  undefined1 local_300 [16];
  undefined1 local_2f0 [16];
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined4 local_2b4;
  undefined4 local_2b0;
  undefined4 uStack_2ac;
  undefined4 uStack_2a8;
  undefined4 uStack_2a4;
  undefined4 local_298;
  undefined4 local_294;
  undefined4 local_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  undefined4 local_278;
  undefined4 local_274;
  undefined4 local_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  undefined4 local_258;
  undefined4 local_254;
  undefined4 local_250;
  undefined4 uStack_24c;
  undefined4 uStack_248;
  undefined4 uStack_244;
  undefined4 local_238;
  undefined4 local_234;
  undefined4 local_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined4 local_218;
  undefined4 local_214;
  undefined4 local_210;
  undefined4 uStack_20c;
  undefined4 uStack_208;
  undefined4 uStack_204;
  undefined4 local_1f8;
  undefined4 local_1f4;
  undefined4 local_1f0;
  undefined4 uStack_1ec;
  undefined4 uStack_1e8;
  undefined4 uStack_1e4;
  undefined4 local_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  undefined4 uStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  undefined4 local_1b8;
  undefined4 local_1b4;
  undefined4 local_1b0;
  undefined4 uStack_1ac;
  undefined4 uStack_1a8;
  undefined4 uStack_1a4;
  undefined4 local_198;
  undefined4 local_194;
  undefined4 local_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined4 local_178;
  undefined4 local_174;
  undefined4 local_170;
  undefined4 uStack_16c;
  undefined4 uStack_168;
  undefined4 uStack_164;
  undefined4 local_158;
  undefined4 local_154;
  undefined4 local_150;
  undefined4 uStack_14c;
  undefined4 uStack_148;
  undefined4 uStack_144;
  undefined4 local_138;
  undefined4 local_134;
  undefined4 local_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined4 local_114;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined1 local_90 [16];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  float *local_48;
  undefined1 (*local_40) [32];
  undefined1 *local_38;
  
  local_23d8 = *in_RSI;
  local_23dc = 0;
  if (in_R8D == 4) {
    local_2490 = *(undefined8 *)in_RSI;
    uStack_2488 = *(undefined8 *)(in_RSI + 2);
  }
  else {
    local_2490 = CONCAT44(local_23d8,local_23d8);
    uStack_2488 = CONCAT44(local_23d8,local_23d8);
    local_2330 = local_23d8;
    fStack_232c = local_23d8;
    fStack_2328 = local_23d8;
    fStack_2324 = local_23d8;
    local_2314 = local_23d8;
  }
  local_23f0 = local_2490;
  uStack_23e8 = uStack_2488;
  if (in_R8D == 8) {
    local_24c0 = *(undefined8 *)in_RSI;
    uStack_24b8 = *(undefined8 *)(in_RSI + 2);
    uStack_24b0 = *(undefined8 *)(in_RSI + 4);
    uStack_24a8 = *(undefined8 *)(in_RSI + 6);
  }
  else {
    local_2310 = local_2490;
    uStack_2308 = uStack_2488;
    local_24c0 = local_2490;
    uStack_24b8 = uStack_2488;
    uStack_24b0 = local_2490;
    uStack_24a8 = uStack_2488;
  }
  local_2420 = local_24c0;
  uStack_2418 = uStack_24b8;
  uStack_2410 = uStack_24b0;
  uStack_2408 = uStack_24a8;
  local_23c8 = in_RDX;
  local_23b8 = in_RDI;
  for (; local_23dc + 7 < in_ECX; local_23dc = local_23dc + 8) {
    local_23b0 = local_23b8;
    local_2440 = *(undefined8 *)*local_23b8;
    uStack_2438 = *(undefined8 *)(*local_23b8 + 8);
    uStack_2430 = *(undefined8 *)(*local_23b8 + 0x10);
    uStack_2428 = *(undefined8 *)(*local_23b8 + 0x18);
    local_22e8 = local_23d1;
    local_22f0 = &local_2440;
    local_22f8 = &local_2420;
    local_2120 = local_24c0;
    uStack_2118 = uStack_24b8;
    uStack_2110 = uStack_24b0;
    uStack_2108 = uStack_24a8;
    auVar39._8_8_ = uStack_24b8;
    auVar39._0_8_ = local_24c0;
    auVar39._16_8_ = uStack_24b0;
    auVar39._24_8_ = uStack_24a8;
    auVar38._8_8_ = uStack_24b8;
    auVar38._0_8_ = local_24c0;
    auVar38._16_8_ = uStack_24b0;
    auVar38._24_8_ = uStack_24a8;
    auVar37._8_8_ = uStack_24b8;
    auVar37._0_8_ = local_24c0;
    auVar37._16_8_ = uStack_24b0;
    auVar37._24_8_ = uStack_24a8;
    auVar36._8_8_ = uStack_24b8;
    auVar36._0_8_ = local_24c0;
    auVar36._16_8_ = uStack_24b0;
    auVar36._24_8_ = uStack_24a8;
    local_20a4 = 0;
    local_2080 = 0;
    auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
    local_20a0 = vinsertps_avx(auVar2,ZEXT416(0),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0),ZEXT416(0),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0),0x20);
    auStack_2090 = vinsertps_avx(auVar2,ZEXT416(0),0x30);
    local_2160 = local_20a0._0_8_;
    uStack_2158 = local_20a0._8_8_;
    uStack_2150 = auStack_2090._0_8_;
    uStack_2148 = auStack_2090._8_8_;
    local_20a8 = 0x80000000;
    local_2040 = 0x80000000;
    auVar2 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x20);
    local_2060 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x20);
    auStack_2050 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x30);
    local_2180 = local_2060._0_8_;
    uStack_2178 = local_2060._8_8_;
    uStack_2170 = auStack_2050._0_8_;
    uStack_2168 = auStack_2050._8_8_;
    local_20ac = 0x40490fdb;
    local_2000 = 0x40490fdb;
    auVar2 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40490fdb),0x20);
    local_2020 = vinsertps_avx(auVar2,ZEXT416(0x40490fdb),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x40490fdb),ZEXT416(0x40490fdb),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40490fdb),0x20);
    auStack_2010 = vinsertps_avx(auVar2,ZEXT416(0x40490fdb),0x30);
    local_21a0 = local_2020._0_8_;
    uStack_2198 = local_2020._8_8_;
    uStack_2190 = auStack_2010._0_8_;
    uStack_2188 = auStack_2010._8_8_;
    local_20b0 = 0x3fc90fdb;
    local_1fc0 = 0x3fc90fdb;
    auVar2 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x20);
    local_1fe0 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x20);
    auStack_1fd0 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x30);
    local_21c0 = local_1fe0._0_8_;
    uStack_21b8 = local_1fe0._8_8_;
    uStack_21b0 = auStack_1fd0._0_8_;
    uStack_21a8 = auStack_1fd0._8_8_;
    auVar1._16_8_ = auStack_2090._0_8_;
    auVar1._0_16_ = local_20a0;
    auVar1._24_8_ = auStack_2090._8_8_;
    local_21e0 = vcmpps_avx(*local_23b8,auVar1,4);
    auVar3._16_8_ = auStack_2090._0_8_;
    auVar3._0_16_ = local_20a0;
    auVar3._24_8_ = auStack_2090._8_8_;
    local_2200 = vcmpps_avx(auVar36,auVar3,4);
    local_1d80 = local_21e0._0_8_;
    uStack_1d78 = local_21e0._8_8_;
    uStack_1d70 = local_21e0._16_8_;
    uStack_1d68 = local_21e0._24_8_;
    local_1da0 = local_2200._0_8_;
    uStack_1d98 = local_2200._8_8_;
    uStack_1d90 = local_2200._16_8_;
    uStack_1d88 = local_2200._24_8_;
    local_2220 = vandps_avx(local_21e0,local_2200);
    local_1dc0 = local_2060._0_8_;
    uStack_1db8 = local_2060._8_8_;
    uStack_1db0 = auStack_2050._0_8_;
    uStack_1da8 = auStack_2050._8_8_;
    auVar17._16_8_ = auStack_2050._0_8_;
    auVar17._0_16_ = local_2060;
    auVar17._24_8_ = auStack_2050._8_8_;
    local_2240 = vandps_avx(auVar17,*local_23b8);
    local_1e00 = local_2060._0_8_;
    uStack_1df8 = local_2060._8_8_;
    uStack_1df0 = auStack_2050._0_8_;
    uStack_1de8 = auStack_2050._8_8_;
    auVar16._16_8_ = auStack_2050._0_8_;
    auVar16._0_16_ = local_2060;
    auVar16._24_8_ = auStack_2050._8_8_;
    local_2260 = vandps_avx(auVar16,auVar37);
    auVar11._16_8_ = auStack_2090._0_8_;
    auVar11._0_16_ = local_20a0;
    auVar11._24_8_ = auStack_2090._8_8_;
    local_1e80 = vcmpps_avx(*local_23b8,auVar11,1);
    local_1e40 = vcmpps_avx(auVar38,auVar11,1);
    local_1e60 = local_2060._0_8_;
    uStack_1e58 = local_2060._8_8_;
    uStack_1e50 = auStack_2050._0_8_;
    uStack_1e48 = auStack_2050._8_8_;
    auVar15._16_8_ = auStack_2050._0_8_;
    auVar15._0_16_ = local_2060;
    auVar15._24_8_ = auStack_2050._8_8_;
    local_1c00 = vandps_avx(local_1e40,auVar15);
    local_1c20 = local_2020._0_8_;
    uStack_1c18 = local_2020._8_8_;
    uStack_1c10 = auStack_2010._0_8_;
    uStack_1c08 = auStack_2010._8_8_;
    auVar20._16_8_ = auStack_2010._0_8_;
    auVar20._0_16_ = local_2020;
    auVar20._24_8_ = auStack_2010._8_8_;
    local_1ea0 = vorps_avx(local_1c00,auVar20);
    local_2280 = vandps_avx(local_1e80,local_1ea0);
    local_1880 = vdivps_avx(auVar39,*local_23b8);
    local_17e4 = 0x80000000;
    local_17c0 = 0x80000000;
    auVar2 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x20);
    local_17e0 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x80000000),ZEXT416(0x80000000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x20);
    auStack_17d0 = vinsertps_avx(auVar2,ZEXT416(0x80000000),0x30);
    local_18a0 = local_17e0._0_8_;
    uStack_1898 = local_17e0._8_8_;
    uStack_1890 = auStack_17d0._0_8_;
    uStack_1888 = auStack_17d0._8_8_;
    local_17e8 = 0x3f800000;
    local_1780 = 0x3f800000;
    auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
    local_17a0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
    auStack_1790 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
    local_18c0 = local_17a0._0_8_;
    uStack_18b8 = local_17a0._8_8_;
    uStack_18b0 = auStack_1790._0_8_;
    uStack_18a8 = auStack_1790._8_8_;
    local_17ec = 0xbf800000;
    local_1740 = 0xbf800000;
    auVar2 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbf800000),0x20);
    local_1760 = vinsertps_avx(auVar2,ZEXT416(0xbf800000),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0xbf800000),ZEXT416(0xbf800000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbf800000),0x20);
    auStack_1750 = vinsertps_avx(auVar2,ZEXT416(0xbf800000),0x30);
    local_18e0 = local_1760._0_8_;
    uStack_18d8 = local_1760._8_8_;
    uStack_18d0 = auStack_1750._0_8_;
    uStack_18c8 = auStack_1750._8_8_;
    local_17f0 = 0x3fc90fdb;
    local_1700 = 0x3fc90fdb;
    auVar2 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x20);
    local_1720 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3fc90fdb),ZEXT416(0x3fc90fdb),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x20);
    auStack_1710 = vinsertps_avx(auVar2,ZEXT416(0x3fc90fdb),0x30);
    local_1900 = local_1720._0_8_;
    uStack_18f8 = local_1720._8_8_;
    uStack_18f0 = auStack_1710._0_8_;
    uStack_18e8 = auStack_1710._8_8_;
    local_17f4 = 0x3f800000;
    local_16c0 = 0x3f800000;
    auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
    local_16e0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
    auStack_16d0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
    local_1920 = local_16e0._0_8_;
    uStack_1918 = local_16e0._8_8_;
    uStack_1910 = auStack_16d0._0_8_;
    uStack_1908 = auStack_16d0._8_8_;
    local_17f8 = 0xbeaaaa53;
    local_1680 = 0xbeaaaa53;
    auVar2 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbeaaaa53),0x20);
    local_16a0 = vinsertps_avx(auVar2,ZEXT416(0xbeaaaa53),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0xbeaaaa53),ZEXT416(0xbeaaaa53),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbeaaaa53),0x20);
    auStack_1690 = vinsertps_avx(auVar2,ZEXT416(0xbeaaaa53),0x30);
    local_1940 = local_16a0._0_8_;
    uStack_1938 = local_16a0._8_8_;
    uStack_1930 = auStack_1690._0_8_;
    uStack_1928 = auStack_1690._8_8_;
    local_17fc = 0x3e4cb974;
    local_1640 = 0x3e4cb974;
    auVar2 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3e4cb974),0x20);
    local_1660 = vinsertps_avx(auVar2,ZEXT416(0x3e4cb974),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3e4cb974),ZEXT416(0x3e4cb974),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3e4cb974),0x20);
    auStack_1650 = vinsertps_avx(auVar2,ZEXT416(0x3e4cb974),0x30);
    local_1960 = local_1660._0_8_;
    uStack_1958 = local_1660._8_8_;
    uStack_1950 = auStack_1650._0_8_;
    uStack_1948 = auStack_1650._8_8_;
    local_1800 = 0xbe117200;
    local_1600 = 0xbe117200;
    auVar2 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbe117200),0x20);
    local_1620 = vinsertps_avx(auVar2,ZEXT416(0xbe117200),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0xbe117200),ZEXT416(0xbe117200),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbe117200),0x20);
    auStack_1610 = vinsertps_avx(auVar2,ZEXT416(0xbe117200),0x30);
    local_1980 = local_1620._0_8_;
    uStack_1978 = local_1620._8_8_;
    uStack_1970 = auStack_1610._0_8_;
    uStack_1968 = auStack_1610._8_8_;
    local_1804 = 0x3dd9ed24;
    local_15c0 = 0x3dd9ed24;
    auVar2 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3dd9ed24),0x20);
    local_15e0 = vinsertps_avx(auVar2,ZEXT416(0x3dd9ed24),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3dd9ed24),ZEXT416(0x3dd9ed24),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3dd9ed24),0x20);
    auStack_15d0 = vinsertps_avx(auVar2,ZEXT416(0x3dd9ed24),0x30);
    local_19a0 = local_15e0._0_8_;
    uStack_1998 = local_15e0._8_8_;
    uStack_1990 = auStack_15d0._0_8_;
    uStack_1988 = auStack_15d0._8_8_;
    local_1808 = 0xbd99b01e;
    local_1580 = 0xbd99b01e;
    auVar2 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbd99b01e),0x20);
    local_15a0 = vinsertps_avx(auVar2,ZEXT416(0xbd99b01e),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0xbd99b01e),ZEXT416(0xbd99b01e),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbd99b01e),0x20);
    auStack_1590 = vinsertps_avx(auVar2,ZEXT416(0xbd99b01e),0x30);
    local_19c0 = local_15a0._0_8_;
    uStack_19b8 = local_15a0._8_8_;
    uStack_19b0 = auStack_1590._0_8_;
    uStack_19a8 = auStack_1590._8_8_;
    local_180c = 0x3d2edd4e;
    local_1540 = 0x3d2edd4e;
    auVar2 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d2edd4e),0x20);
    local_1560 = vinsertps_avx(auVar2,ZEXT416(0x3d2edd4e),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3d2edd4e),ZEXT416(0x3d2edd4e),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d2edd4e),0x20);
    auStack_1550 = vinsertps_avx(auVar2,ZEXT416(0x3d2edd4e),0x30);
    local_19e0 = local_1560._0_8_;
    uStack_19d8 = local_1560._8_8_;
    uStack_19d0 = auStack_1550._0_8_;
    uStack_19c8 = auStack_1550._8_8_;
    local_1810 = 0xbc83a25c;
    local_1500 = 0xbc83a25c;
    auVar2 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbc83a25c),0x20);
    local_1520 = vinsertps_avx(auVar2,ZEXT416(0xbc83a25c),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0xbc83a25c),ZEXT416(0xbc83a25c),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0xbc83a25c),0x20);
    auStack_1510 = vinsertps_avx(auVar2,ZEXT416(0xbc83a25c),0x30);
    local_1a00 = local_1520._0_8_;
    uStack_19f8 = local_1520._8_8_;
    uStack_19f0 = auStack_1510._0_8_;
    uStack_19e8 = auStack_1510._8_8_;
    local_1814 = 0x3b3ac537;
    local_14c0 = 0x3b3ac537;
    auVar2 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3b3ac537),0x20);
    local_14e0 = vinsertps_avx(auVar2,ZEXT416(0x3b3ac537),0x30);
    auVar2 = vinsertps_avx(ZEXT416(0x3b3ac537),ZEXT416(0x3b3ac537),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3b3ac537),0x20);
    auStack_14d0 = vinsertps_avx(auVar2,ZEXT416(0x3b3ac537),0x30);
    local_1a20 = local_14e0._0_8_;
    uStack_1a18 = local_14e0._8_8_;
    uStack_1a10 = auStack_14d0._0_8_;
    uStack_1a08 = auStack_14d0._8_8_;
    local_1200 = local_17e0._0_8_;
    uStack_11f8 = local_17e0._8_8_;
    uStack_11f0 = auStack_17d0._0_8_;
    uStack_11e8 = auStack_17d0._8_8_;
    local_1220 = local_1880._0_8_;
    uStack_1218 = local_1880._8_8_;
    uStack_1210 = local_1880._16_8_;
    uStack_1208 = local_1880._24_8_;
    auVar24._16_8_ = auStack_17d0._0_8_;
    auVar24._0_16_ = local_17e0;
    auVar24._24_8_ = auStack_17d0._8_8_;
    local_1a40 = vandps_avx(auVar24,local_1880);
    local_d80 = local_17e0._0_8_;
    uStack_d78 = local_17e0._8_8_;
    uStack_d70 = auStack_17d0._0_8_;
    uStack_d68 = auStack_17d0._8_8_;
    local_da0 = local_1880._0_8_;
    uStack_d98 = local_1880._8_8_;
    uStack_d90 = local_1880._16_8_;
    uStack_d88 = local_1880._24_8_;
    auVar27._16_8_ = auStack_17d0._0_8_;
    auVar27._0_16_ = local_17e0;
    auVar27._24_8_ = auStack_17d0._8_8_;
    auVar1 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
    local_1a60 = vandnps_avx(auVar27,local_1880);
    auVar21._16_8_ = auStack_1790._0_8_;
    auVar21._0_16_ = local_17a0;
    auVar21._24_8_ = auStack_1790._8_8_;
    local_1a80 = vcmpps_avx(auVar21,local_1a60,1);
    local_1240 = local_1a80._0_8_;
    uStack_1238 = local_1a80._8_8_;
    uStack_1230 = local_1a80._16_8_;
    uStack_1228 = local_1a80._24_8_;
    local_1260 = local_1760._0_8_;
    uStack_1258 = local_1760._8_8_;
    uStack_1250 = auStack_1750._0_8_;
    uStack_1248 = auStack_1750._8_8_;
    auVar23._16_8_ = auStack_1750._0_8_;
    auVar23._0_16_ = local_1760;
    auVar23._24_8_ = auStack_1750._8_8_;
    local_e40 = vandps_avx(local_1a80,auVar23);
    local_dc0 = local_1a80._0_8_;
    uStack_db8 = local_1a80._8_8_;
    uStack_db0 = local_1a80._16_8_;
    uStack_da8 = local_1a80._24_8_;
    local_de0 = local_1a60._0_8_;
    uStack_dd8 = local_1a60._8_8_;
    uStack_dd0 = local_1a60._16_8_;
    uStack_dc8 = local_1a60._24_8_;
    local_e60 = vandnps_avx(local_1a80,local_1a60);
    local_13c0 = vorps_avx(local_e40,local_e60);
    local_1280 = local_1a80._0_8_;
    uStack_1278 = local_1a80._8_8_;
    uStack_1270 = local_1a80._16_8_;
    uStack_1268 = local_1a80._24_8_;
    local_12a0 = local_1a60._0_8_;
    uStack_1298 = local_1a60._8_8_;
    uStack_1290 = local_1a60._16_8_;
    uStack_1288 = local_1a60._24_8_;
    local_e80 = vandps_avx(local_1a80,local_1a60);
    local_e00 = local_1a80._0_8_;
    uStack_df8 = local_1a80._8_8_;
    uStack_df0 = local_1a80._16_8_;
    uStack_de8 = local_1a80._24_8_;
    local_e20 = local_17a0._0_8_;
    uStack_e18 = local_17a0._8_8_;
    uStack_e10 = auStack_1790._0_8_;
    uStack_e08 = auStack_1790._8_8_;
    auVar26._16_8_ = auStack_1790._0_8_;
    auVar26._0_16_ = local_17a0;
    auVar26._24_8_ = auStack_1790._8_8_;
    local_ea0 = vandnps_avx(local_1a80,auVar26);
    local_13e0 = vorps_avx(local_e80,local_ea0);
    local_1aa0 = vdivps_avx(local_13c0,local_13e0);
    local_1420 = local_1aa0._0_8_;
    uStack_1418 = local_1aa0._8_8_;
    uStack_1410 = local_1aa0._16_8_;
    uStack_1408 = local_1aa0._24_8_;
    local_1400._0_4_ = local_1aa0._0_4_;
    local_1400._4_4_ = local_1aa0._4_4_;
    uStack_13f8._0_4_ = local_1aa0._8_4_;
    uStack_13f8._4_4_ = local_1aa0._12_4_;
    uStack_13f0._0_4_ = local_1aa0._16_4_;
    uStack_13f0._4_4_ = local_1aa0._20_4_;
    uStack_13e8._0_4_ = local_1aa0._24_4_;
    uStack_13e8._4_4_ = local_1aa0._28_4_;
    fStack_1aa4 = uStack_13e8._4_4_;
    local_1ac0 = (float)local_1400 * (float)local_1400;
    fStack_1abc = local_1400._4_4_ * local_1400._4_4_;
    fStack_1ab8 = (float)uStack_13f8 * (float)uStack_13f8;
    fStack_1ab4 = uStack_13f8._4_4_ * uStack_13f8._4_4_;
    fStack_1ab0 = (float)uStack_13f0 * (float)uStack_13f0;
    fStack_1aac = uStack_13f0._4_4_ * uStack_13f0._4_4_;
    fStack_1aa8 = (float)uStack_13e8 * (float)uStack_13e8;
    local_1460 = CONCAT44(fStack_1abc,local_1ac0);
    uStack_1458 = CONCAT44(fStack_1ab4,fStack_1ab8);
    uStack_1450 = CONCAT44(fStack_1aac,fStack_1ab0);
    uStack_1448 = CONCAT44(uStack_13e8._4_4_,fStack_1aa8);
    fStack_1ac4 = uStack_13e8._4_4_;
    local_1ae0 = local_1ac0 * local_1ac0;
    fStack_1adc = fStack_1abc * fStack_1abc;
    fStack_1ad8 = fStack_1ab8 * fStack_1ab8;
    fStack_1ad4 = fStack_1ab4 * fStack_1ab4;
    fStack_1ad0 = fStack_1ab0 * fStack_1ab0;
    fStack_1acc = fStack_1aac * fStack_1aac;
    fStack_1ac8 = fStack_1aa8 * fStack_1aa8;
    local_1378 = &local_1ae0;
    local_12f0 = &local_1a00;
    local_12f8 = &local_19c0;
    local_11a0 = CONCAT44(fStack_1adc,local_1ae0);
    uStack_1198 = CONCAT44(fStack_1ad4,fStack_1ad8);
    uStack_1190 = CONCAT44(fStack_1acc,fStack_1ad0);
    uStack_1188 = CONCAT44(uStack_13e8._4_4_,fStack_1ac8);
    auVar44._4_4_ = fStack_1adc;
    auVar44._0_4_ = local_1ae0;
    auVar44._8_4_ = fStack_1ad8;
    auVar44._12_4_ = fStack_1ad4;
    auVar44._16_4_ = fStack_1ad0;
    auVar44._20_4_ = fStack_1acc;
    auVar44._24_4_ = fStack_1ac8;
    auVar44._28_4_ = uStack_13e8._4_4_;
    local_11c0 = local_1520._0_8_;
    uStack_11b8 = local_1520._8_8_;
    uStack_11b0 = auStack_1510._0_8_;
    uStack_11a8 = auStack_1510._8_8_;
    auVar53._16_8_ = auStack_1510._0_8_;
    auVar53._0_16_ = local_1520;
    auVar53._24_8_ = auStack_1510._8_8_;
    local_11e0 = local_15a0._0_8_;
    uStack_11d8 = local_15a0._8_8_;
    uStack_11d0 = auStack_1590._0_8_;
    uStack_11c8 = auStack_1590._8_8_;
    auVar55._16_8_ = auStack_1590._0_8_;
    auVar55._0_16_ = local_15a0;
    auVar55._24_8_ = auStack_1590._8_8_;
    auVar2 = vfmadd213ps_fma(auVar53,auVar44,auVar55);
    local_1308 = local_1b60;
    local_1310 = &local_1980;
    local_1140 = CONCAT44(fStack_1adc,local_1ae0);
    uStack_1138 = CONCAT44(fStack_1ad4,fStack_1ad8);
    uStack_1130 = CONCAT44(fStack_1acc,fStack_1ad0);
    uStack_1128 = CONCAT44(uStack_13e8._4_4_,fStack_1ac8);
    auVar45._4_4_ = fStack_1adc;
    auVar45._0_4_ = local_1ae0;
    auVar45._8_4_ = fStack_1ad8;
    auVar45._12_4_ = fStack_1ad4;
    auVar45._16_4_ = fStack_1ad0;
    auVar45._20_4_ = fStack_1acc;
    auVar45._24_4_ = fStack_1ac8;
    auVar45._28_4_ = uStack_13e8._4_4_;
    local_1b60._0_8_ = auVar2._0_8_;
    local_1160 = local_1b60._0_8_;
    local_1b60._8_8_ = auVar2._8_8_;
    uStack_1158 = local_1b60._8_8_;
    uStack_1150 = 0;
    uStack_1148 = 0;
    local_1180 = local_1620._0_8_;
    uStack_1178 = local_1620._8_8_;
    uStack_1170 = auStack_1610._0_8_;
    uStack_1168 = auStack_1610._8_8_;
    auVar57._16_8_ = auStack_1610._0_8_;
    auVar57._0_16_ = local_1620;
    auVar57._24_8_ = auStack_1610._8_8_;
    auVar4 = vfmadd213ps_fma(ZEXT1632(auVar2),auVar45,auVar57);
    local_1320 = local_1b40;
    local_1328 = &local_1940;
    local_10e0 = CONCAT44(fStack_1adc,local_1ae0);
    uStack_10d8 = CONCAT44(fStack_1ad4,fStack_1ad8);
    uStack_10d0 = CONCAT44(fStack_1acc,fStack_1ad0);
    uStack_10c8 = CONCAT44(uStack_13e8._4_4_,fStack_1ac8);
    auVar46._4_4_ = fStack_1adc;
    auVar46._0_4_ = local_1ae0;
    auVar46._8_4_ = fStack_1ad8;
    auVar46._12_4_ = fStack_1ad4;
    auVar46._16_4_ = fStack_1ad0;
    auVar46._20_4_ = fStack_1acc;
    auVar46._24_4_ = fStack_1ac8;
    auVar46._28_4_ = uStack_13e8._4_4_;
    local_1b40._0_8_ = auVar4._0_8_;
    local_1100 = local_1b40._0_8_;
    local_1b40._8_8_ = auVar4._8_8_;
    uStack_10f8 = local_1b40._8_8_;
    uStack_10f0 = 0;
    uStack_10e8 = 0;
    local_1120 = local_16a0._0_8_;
    uStack_1118 = local_16a0._8_8_;
    uStack_1110 = auStack_1690._0_8_;
    uStack_1108 = auStack_1690._8_8_;
    auVar59._16_8_ = auStack_1690._0_8_;
    auVar59._0_16_ = local_16a0;
    auVar59._24_8_ = auStack_1690._8_8_;
    auVar5 = vfmadd213ps_fma(ZEXT1632(auVar4),auVar46,auVar59);
    local_1338 = &local_1a20;
    local_1340 = &local_19e0;
    local_1080 = CONCAT44(fStack_1adc,local_1ae0);
    uStack_1078 = CONCAT44(fStack_1ad4,fStack_1ad8);
    uStack_1070 = CONCAT44(fStack_1acc,fStack_1ad0);
    uStack_1068 = CONCAT44(uStack_13e8._4_4_,fStack_1ac8);
    auVar47._4_4_ = fStack_1adc;
    auVar47._0_4_ = local_1ae0;
    auVar47._8_4_ = fStack_1ad8;
    auVar47._12_4_ = fStack_1ad4;
    auVar47._16_4_ = fStack_1ad0;
    auVar47._20_4_ = fStack_1acc;
    auVar47._24_4_ = fStack_1ac8;
    auVar47._28_4_ = uStack_13e8._4_4_;
    local_10a0 = local_14e0._0_8_;
    uStack_1098 = local_14e0._8_8_;
    uStack_1090 = auStack_14d0._0_8_;
    uStack_1088 = auStack_14d0._8_8_;
    auVar52._16_8_ = auStack_14d0._0_8_;
    auVar52._0_16_ = local_14e0;
    auVar52._24_8_ = auStack_14d0._8_8_;
    local_10c0 = local_1560._0_8_;
    uStack_10b8 = local_1560._8_8_;
    uStack_10b0 = auStack_1550._0_8_;
    uStack_10a8 = auStack_1550._8_8_;
    auVar54._16_8_ = auStack_1550._0_8_;
    auVar54._0_16_ = local_1560;
    auVar54._24_8_ = auStack_1550._8_8_;
    auVar6 = vfmadd213ps_fma(auVar52,auVar47,auVar54);
    local_1350 = local_1be0;
    local_1358 = &local_19a0;
    local_1020 = CONCAT44(fStack_1adc,local_1ae0);
    uStack_1018 = CONCAT44(fStack_1ad4,fStack_1ad8);
    uStack_1010 = CONCAT44(fStack_1acc,fStack_1ad0);
    uStack_1008 = CONCAT44(uStack_13e8._4_4_,fStack_1ac8);
    auVar48._4_4_ = fStack_1adc;
    auVar48._0_4_ = local_1ae0;
    auVar48._8_4_ = fStack_1ad8;
    auVar48._12_4_ = fStack_1ad4;
    auVar48._16_4_ = fStack_1ad0;
    auVar48._20_4_ = fStack_1acc;
    auVar48._24_4_ = fStack_1ac8;
    auVar48._28_4_ = uStack_13e8._4_4_;
    local_1be0._0_8_ = auVar6._0_8_;
    local_1040 = local_1be0._0_8_;
    local_1be0._8_8_ = auVar6._8_8_;
    uStack_1038 = local_1be0._8_8_;
    uStack_1030 = 0;
    uStack_1028 = 0;
    local_1060 = local_15e0._0_8_;
    uStack_1058 = local_15e0._8_8_;
    uStack_1050 = auStack_15d0._0_8_;
    uStack_1048 = auStack_15d0._8_8_;
    auVar56._16_8_ = auStack_15d0._0_8_;
    auVar56._0_16_ = local_15e0;
    auVar56._24_8_ = auStack_15d0._8_8_;
    auVar7 = vfmadd213ps_fma(ZEXT1632(auVar6),auVar48,auVar56);
    local_1368 = local_1bc0;
    local_1370 = &local_1960;
    local_fc0 = CONCAT44(fStack_1adc,local_1ae0);
    uStack_fb8 = CONCAT44(fStack_1ad4,fStack_1ad8);
    uStack_fb0 = CONCAT44(fStack_1acc,fStack_1ad0);
    uStack_fa8 = CONCAT44(uStack_13e8._4_4_,fStack_1ac8);
    auVar49._4_4_ = fStack_1adc;
    auVar49._0_4_ = local_1ae0;
    auVar49._8_4_ = fStack_1ad8;
    auVar49._12_4_ = fStack_1ad4;
    auVar49._16_4_ = fStack_1ad0;
    auVar49._20_4_ = fStack_1acc;
    auVar49._24_4_ = fStack_1ac8;
    auVar49._28_4_ = uStack_13e8._4_4_;
    local_1bc0._0_8_ = auVar7._0_8_;
    local_fe0 = local_1bc0._0_8_;
    local_1bc0._8_8_ = auVar7._8_8_;
    uStack_fd8 = local_1bc0._8_8_;
    uStack_fd0 = 0;
    uStack_fc8 = 0;
    local_1000 = local_1660._0_8_;
    uStack_ff8 = local_1660._8_8_;
    uStack_ff0 = auStack_1650._0_8_;
    uStack_fe8 = auStack_1650._8_8_;
    auVar58._16_8_ = auStack_1650._0_8_;
    auVar58._0_16_ = local_1660;
    auVar58._24_8_ = auStack_1650._8_8_;
    auVar8 = vfmadd213ps_fma(ZEXT1632(auVar7),auVar49,auVar58);
    local_1380 = local_1ba0;
    local_1388 = &local_1920;
    local_f60 = CONCAT44(fStack_1adc,local_1ae0);
    uStack_f58 = CONCAT44(fStack_1ad4,fStack_1ad8);
    uStack_f50 = CONCAT44(fStack_1acc,fStack_1ad0);
    uStack_f48 = CONCAT44(uStack_13e8._4_4_,fStack_1ac8);
    auVar50._4_4_ = fStack_1adc;
    auVar50._0_4_ = local_1ae0;
    auVar50._8_4_ = fStack_1ad8;
    auVar50._12_4_ = fStack_1ad4;
    auVar50._16_4_ = fStack_1ad0;
    auVar50._20_4_ = fStack_1acc;
    auVar50._24_4_ = fStack_1ac8;
    auVar50._28_4_ = uStack_13e8._4_4_;
    local_1ba0._0_8_ = auVar8._0_8_;
    local_f80 = local_1ba0._0_8_;
    local_1ba0._8_8_ = auVar8._8_8_;
    uStack_f78 = local_1ba0._8_8_;
    uStack_f70 = 0;
    uStack_f68 = 0;
    local_fa0 = local_16e0._0_8_;
    uStack_f98 = local_16e0._8_8_;
    uStack_f90 = auStack_16d0._0_8_;
    uStack_f88 = auStack_16d0._8_8_;
    auVar60._16_8_ = auStack_16d0._0_8_;
    auVar60._0_16_ = local_16e0;
    auVar60._24_8_ = auStack_16d0._8_8_;
    auVar9 = vfmadd213ps_fma(ZEXT1632(auVar8),auVar50,auVar60);
    local_1390 = &local_1ac0;
    local_1398 = local_1b20;
    local_13a0 = local_1b80;
    local_f00 = CONCAT44(fStack_1abc,local_1ac0);
    uStack_ef8 = CONCAT44(fStack_1ab4,fStack_1ab8);
    uStack_ef0 = CONCAT44(fStack_1aac,fStack_1ab0);
    uStack_ee8 = CONCAT44(uStack_13e8._4_4_,fStack_1aa8);
    auVar51._4_4_ = fStack_1abc;
    auVar51._0_4_ = local_1ac0;
    auVar51._8_4_ = fStack_1ab8;
    auVar51._12_4_ = fStack_1ab4;
    auVar51._16_4_ = fStack_1ab0;
    auVar51._20_4_ = fStack_1aac;
    auVar51._24_4_ = fStack_1aa8;
    auVar51._28_4_ = uStack_13e8._4_4_;
    local_1b20._0_8_ = auVar5._0_8_;
    local_f20 = local_1b20._0_8_;
    local_1b20._8_8_ = auVar5._8_8_;
    uStack_f18 = local_1b20._8_8_;
    uStack_f10 = 0;
    uStack_f08 = 0;
    local_1b80._0_8_ = auVar9._0_8_;
    local_f40 = local_1b80._0_8_;
    local_1b80._8_8_ = auVar9._8_8_;
    uStack_f38 = local_1b80._8_8_;
    uStack_f30 = 0;
    uStack_f28 = 0;
    auVar10 = vfmadd213ps_fma(ZEXT1632(auVar5),auVar51,ZEXT1632(auVar9));
    local_1b00._0_8_ = auVar10._0_8_;
    local_1b00._8_8_ = auVar10._8_8_;
    uStack_1470 = 0;
    uStack_1468 = 0;
    local_14a0 = local_1aa0._0_8_;
    uStack_1498 = local_1aa0._8_8_;
    uStack_1490 = local_1aa0._16_8_;
    uStack_1488 = local_1aa0._24_8_;
    local_1480._0_4_ = auVar10._0_4_;
    local_1480._4_4_ = auVar10._4_4_;
    uStack_1478._0_4_ = auVar10._8_4_;
    uStack_1478._4_4_ = auVar10._12_4_;
    fStack_1824 = uStack_13e8._4_4_;
    local_1840 = (float)local_1480 * (float)local_1400;
    fStack_183c = local_1480._4_4_ * local_1400._4_4_;
    fStack_1838 = (float)uStack_1478 * (float)uStack_13f8;
    fStack_1834 = uStack_1478._4_4_ * uStack_13f8._4_4_;
    fStack_1830 = (float)uStack_13f0 * 0.0;
    fStack_182c = uStack_13f0._4_4_ * 0.0;
    fStack_1828 = (float)uStack_13e8 * 0.0;
    local_12c0 = local_1a80._0_8_;
    uStack_12b8 = local_1a80._8_8_;
    uStack_12b0 = local_1a80._16_8_;
    uStack_12a8 = local_1a80._24_8_;
    local_12e0 = local_1720._0_8_;
    uStack_12d8 = local_1720._8_8_;
    uStack_12d0 = auStack_1710._0_8_;
    uStack_12c8 = auStack_1710._8_8_;
    auVar22._16_8_ = auStack_1710._0_8_;
    auVar22._0_16_ = local_1720;
    auVar22._24_8_ = auStack_1710._8_8_;
    _local_1860 = vandps_avx(local_1a80,auVar22);
    local_ec0 = local_1840 + (float)local_1860._0_4_;
    fStack_ebc = fStack_183c + (float)local_1860._4_4_;
    fStack_eb8 = fStack_1838 + fStack_1858;
    fStack_eb4 = fStack_1834 + fStack_1854;
    fStack_eb0 = fStack_1830 + fStack_1850;
    fStack_eac = fStack_182c + fStack_184c;
    fStack_ea8 = fStack_1828 + fStack_1848;
    fStack_ea4 = uStack_13e8._4_4_ + fStack_1844;
    local_ee0 = local_1a40._0_8_;
    uStack_ed8 = local_1a40._8_8_;
    uStack_ed0 = local_1a40._16_8_;
    uStack_ec8 = local_1a40._24_8_;
    auVar25._4_4_ = fStack_ebc;
    auVar25._0_4_ = local_ec0;
    auVar25._8_4_ = fStack_eb8;
    auVar25._12_4_ = fStack_eb4;
    auVar25._16_4_ = fStack_eb0;
    auVar25._20_4_ = fStack_eac;
    auVar25._24_4_ = fStack_ea8;
    auVar25._28_4_ = fStack_ea4;
    _local_20e0 = vorps_avx(auVar25,local_1a40);
    local_2100._0_4_ = local_2280._0_4_;
    local_2100._4_4_ = local_2280._4_4_;
    uStack_20f8._0_4_ = local_2280._8_4_;
    uStack_20f8._4_4_ = local_2280._12_4_;
    uStack_20f0._0_4_ = local_2280._16_4_;
    uStack_20f0._4_4_ = local_2280._20_4_;
    uStack_20e8._0_4_ = local_2280._24_4_;
    uStack_20e8._4_4_ = local_2280._28_4_;
    local_22a0 = (float)local_20e0._0_4_ + (float)local_2100;
    fStack_229c = (float)local_20e0._4_4_ + local_2100._4_4_;
    fStack_2298 = fStack_20d8 + (float)uStack_20f8;
    fStack_2294 = fStack_20d4 + uStack_20f8._4_4_;
    fStack_2290 = fStack_20d0 + (float)uStack_20f0;
    fStack_228c = fStack_20cc + uStack_20f0._4_4_;
    fStack_2288 = fStack_20c8 + (float)uStack_20e8;
    fStack_2284 = fStack_20c4 + uStack_20e8._4_4_;
    local_1c40 = local_2240._0_8_;
    uStack_1c38 = local_2240._8_8_;
    uStack_1c30 = local_2240._16_8_;
    uStack_1c28 = local_2240._24_8_;
    local_1c60 = local_2020._0_8_;
    uStack_1c58 = local_2020._8_8_;
    uStack_1c50 = auStack_2010._0_8_;
    uStack_1c48 = auStack_2010._8_8_;
    auVar19._16_8_ = auStack_2010._0_8_;
    auVar19._0_16_ = local_2020;
    auVar19._24_8_ = auStack_2010._8_8_;
    auVar3 = vorps_avx(local_2240,auVar19);
    auVar12._16_8_ = auStack_2090._0_8_;
    auVar12._0_16_ = local_20a0;
    auVar12._24_8_ = auStack_2090._8_8_;
    local_22c0 = vcmpps_avx(auVar3,auVar12,1);
    local_1ec0 = local_2200._0_8_;
    uStack_1eb8 = local_2200._8_8_;
    uStack_1eb0 = local_2200._16_8_;
    uStack_1ea8 = local_2200._24_8_;
    local_1c80 = local_2260._0_8_;
    uStack_1c78 = local_2260._8_8_;
    uStack_1c70 = local_2260._16_8_;
    uStack_1c68 = local_2260._24_8_;
    local_1ca0 = local_1fe0._0_8_;
    uStack_1c98 = local_1fe0._8_8_;
    uStack_1c90 = auStack_1fd0._0_8_;
    uStack_1c88 = auStack_1fd0._8_8_;
    auVar18._16_8_ = auStack_1fd0._0_8_;
    auVar18._0_16_ = local_1fe0;
    auVar18._24_8_ = auStack_1fd0._8_8_;
    local_1ee0 = vorps_avx(local_2260,auVar18);
    local_1d00 = vandps_avx(local_2200,local_1ee0);
    local_d00 = local_2200._0_8_;
    uStack_cf8 = local_2200._8_8_;
    uStack_cf0 = local_2200._16_8_;
    uStack_ce8 = local_2200._24_8_;
    local_1f00 = local_22c0._0_8_;
    uStack_1ef8 = local_22c0._8_8_;
    uStack_1ef0 = local_22c0._16_8_;
    uStack_1ee8 = local_22c0._24_8_;
    local_1f20 = local_2020._0_8_;
    uStack_1f18 = local_2020._8_8_;
    uStack_1f10 = auStack_2010._0_8_;
    uStack_1f08 = auStack_2010._8_8_;
    auVar14._16_8_ = auStack_2010._0_8_;
    auVar14._0_16_ = local_2020;
    auVar14._24_8_ = auStack_2010._8_8_;
    local_1cc0 = vandps_avx(local_22c0,auVar14);
    local_cc0 = local_22c0._0_8_;
    uStack_cb8 = local_22c0._8_8_;
    uStack_cb0 = local_22c0._16_8_;
    uStack_ca8 = local_22c0._24_8_;
    local_ce0 = local_20a0._0_8_;
    uStack_cd8 = local_20a0._8_8_;
    uStack_cd0 = auStack_2090._0_8_;
    uStack_cc8 = auStack_2090._8_8_;
    auVar28._16_8_ = auStack_2090._0_8_;
    auVar28._0_16_ = local_20a0;
    auVar28._24_8_ = auStack_2090._8_8_;
    local_1ce0 = vandnps_avx(local_22c0,auVar28);
    local_d20 = vorps_avx(local_1cc0,local_1ce0);
    local_1d20 = vandnps_avx(local_2200,local_d20);
    local_22e0 = vorps_avx(local_1d00,local_1d20);
    local_1f40 = local_2220._0_8_;
    uStack_1f38 = local_2220._8_8_;
    uStack_1f30 = local_2220._16_8_;
    uStack_1f28 = local_2220._24_8_;
    local_1f60 = CONCAT44(fStack_229c,local_22a0);
    uStack_1f58 = CONCAT44(fStack_2294,fStack_2298);
    uStack_1f50 = CONCAT44(fStack_228c,fStack_2290);
    uStack_1f48 = CONCAT44(fStack_2284,fStack_2288);
    auVar13._8_8_ = uStack_1f58;
    auVar13._0_8_ = local_1f60;
    auVar13._16_8_ = uStack_1f50;
    auVar13._24_8_ = uStack_1f48;
    local_1d40 = vandps_avx(local_2220,auVar13);
    local_d60 = local_22e0._0_8_;
    uStack_d58 = local_22e0._8_8_;
    uStack_d50 = local_22e0._16_8_;
    uStack_d48 = local_22e0._24_8_;
    local_d40._0_4_ = local_2220._0_4_;
    local_d40._4_4_ = local_2220._4_4_;
    uStack_d38._0_4_ = local_2220._8_4_;
    uStack_d38._4_4_ = local_2220._12_4_;
    uStack_d30._0_4_ = local_2220._16_4_;
    uStack_d30._4_4_ = local_2220._20_4_;
    uStack_d28._0_4_ = local_2220._24_4_;
    uStack_d28._4_4_ = local_2220._28_4_;
    auVar79._0_4_ = (uint)local_d40 ^ auVar1._0_4_;
    auVar79._4_4_ = local_d40._4_4_ ^ auVar1._4_4_;
    auVar79._8_4_ = (uint)uStack_d38 ^ auVar1._8_4_;
    auVar79._12_4_ = uStack_d38._4_4_ ^ auVar1._12_4_;
    auVar79._16_4_ = (uint)uStack_d30 ^ auVar1._16_4_;
    auVar79._20_4_ = uStack_d30._4_4_ ^ auVar1._20_4_;
    auVar79._24_4_ = (uint)uStack_d28 ^ auVar1._24_4_;
    auVar79._28_4_ = uStack_d28._4_4_ ^ auVar1._28_4_;
    local_1d60 = vandps_avx(auVar79,local_22e0);
    local_2460 = vorps_avx(local_1d40,local_1d60);
    local_2368 = local_23c8;
    local_23a0 = local_2460._0_8_;
    uStack_2398 = local_2460._8_8_;
    uStack_2390 = local_2460._16_8_;
    uStack_2388 = local_2460._24_8_;
    *(undefined8 *)local_23c8 = local_2460._0_8_;
    *(undefined8 *)(local_23c8 + 2) = local_2460._8_8_;
    *(undefined8 *)(local_23c8 + 4) = local_2460._16_8_;
    *(undefined8 *)(local_23c8 + 6) = local_2460._24_8_;
    local_23b8 = local_23b8 + 1;
    local_23c8 = local_23c8 + 8;
    local_2140 = local_2440;
    uStack_2138 = uStack_2438;
    uStack_2130 = uStack_2430;
    uStack_2128 = uStack_2428;
    local_2100 = local_2280._0_8_;
    uStack_20f8 = local_2280._8_8_;
    uStack_20f0 = local_2280._16_8_;
    uStack_20e8 = local_2280._24_8_;
    local_207c = local_2080;
    local_2078 = local_2080;
    local_2074 = local_2080;
    local_2070 = local_2080;
    local_206c = local_2080;
    local_2068 = local_2080;
    local_2064 = local_2080;
    local_203c = local_2040;
    local_2038 = local_2040;
    local_2034 = local_2040;
    local_2030 = local_2040;
    local_202c = local_2040;
    local_2028 = local_2040;
    local_2024 = local_2040;
    local_1ffc = local_2000;
    local_1ff8 = local_2000;
    local_1ff4 = local_2000;
    local_1ff0 = local_2000;
    local_1fec = local_2000;
    local_1fe8 = local_2000;
    local_1fe4 = local_2000;
    local_1fbc = local_1fc0;
    local_1fb8 = local_1fc0;
    local_1fb4 = local_1fc0;
    local_1fb0 = local_1fc0;
    local_1fac = local_1fc0;
    local_1fa8 = local_1fc0;
    local_1fa4 = local_1fc0;
    local_1fa0 = local_2440;
    uStack_1f98 = uStack_2438;
    uStack_1f90 = uStack_2430;
    uStack_1f88 = uStack_2428;
    local_1f80 = local_2120;
    uStack_1f78 = uStack_2118;
    uStack_1f70 = uStack_2110;
    uStack_1f68 = uStack_2108;
    local_1e20 = local_2120;
    uStack_1e18 = uStack_2118;
    uStack_1e10 = uStack_2110;
    uStack_1e08 = uStack_2108;
    local_1de0 = local_2440;
    uStack_1dd8 = uStack_2438;
    uStack_1dd0 = uStack_2430;
    uStack_1dc8 = uStack_2428;
    local_1be0 = ZEXT1632(auVar6);
    local_1bc0 = ZEXT1632(auVar7);
    local_1ba0 = ZEXT1632(auVar8);
    local_1b80 = ZEXT1632(auVar9);
    local_1b60 = ZEXT1632(auVar2);
    local_1b40 = ZEXT1632(auVar4);
    local_1b20 = ZEXT1632(auVar5);
    local_1b00 = ZEXT1632(auVar10);
    local_17bc = local_17c0;
    local_17b8 = local_17c0;
    local_17b4 = local_17c0;
    local_17b0 = local_17c0;
    local_17ac = local_17c0;
    local_17a8 = local_17c0;
    local_17a4 = local_17c0;
    local_177c = local_1780;
    local_1778 = local_1780;
    local_1774 = local_1780;
    local_1770 = local_1780;
    local_176c = local_1780;
    local_1768 = local_1780;
    local_1764 = local_1780;
    local_173c = local_1740;
    local_1738 = local_1740;
    local_1734 = local_1740;
    local_1730 = local_1740;
    local_172c = local_1740;
    local_1728 = local_1740;
    local_1724 = local_1740;
    local_16fc = local_1700;
    local_16f8 = local_1700;
    local_16f4 = local_1700;
    local_16f0 = local_1700;
    local_16ec = local_1700;
    local_16e8 = local_1700;
    local_16e4 = local_1700;
    local_16bc = local_16c0;
    local_16b8 = local_16c0;
    local_16b4 = local_16c0;
    local_16b0 = local_16c0;
    local_16ac = local_16c0;
    local_16a8 = local_16c0;
    local_16a4 = local_16c0;
    local_167c = local_1680;
    local_1678 = local_1680;
    local_1674 = local_1680;
    local_1670 = local_1680;
    local_166c = local_1680;
    local_1668 = local_1680;
    local_1664 = local_1680;
    local_163c = local_1640;
    local_1638 = local_1640;
    local_1634 = local_1640;
    local_1630 = local_1640;
    local_162c = local_1640;
    local_1628 = local_1640;
    local_1624 = local_1640;
    local_15fc = local_1600;
    local_15f8 = local_1600;
    local_15f4 = local_1600;
    local_15f0 = local_1600;
    local_15ec = local_1600;
    local_15e8 = local_1600;
    local_15e4 = local_1600;
    local_15bc = local_15c0;
    local_15b8 = local_15c0;
    local_15b4 = local_15c0;
    local_15b0 = local_15c0;
    local_15ac = local_15c0;
    local_15a8 = local_15c0;
    local_15a4 = local_15c0;
    local_157c = local_1580;
    local_1578 = local_1580;
    local_1574 = local_1580;
    local_1570 = local_1580;
    local_156c = local_1580;
    local_1568 = local_1580;
    local_1564 = local_1580;
    local_153c = local_1540;
    local_1538 = local_1540;
    local_1534 = local_1540;
    local_1530 = local_1540;
    local_152c = local_1540;
    local_1528 = local_1540;
    local_1524 = local_1540;
    local_14fc = local_1500;
    local_14f8 = local_1500;
    local_14f4 = local_1500;
    local_14f0 = local_1500;
    local_14ec = local_1500;
    local_14e8 = local_1500;
    local_14e4 = local_1500;
    local_14bc = local_14c0;
    local_14b8 = local_14c0;
    local_14b4 = local_14c0;
    local_14b0 = local_14c0;
    local_14ac = local_14c0;
    local_14a8 = local_14c0;
    local_14a4 = local_14c0;
    local_1480 = local_1b00._0_8_;
    uStack_1478 = local_1b00._8_8_;
    local_1440 = local_1460;
    uStack_1438 = uStack_1458;
    uStack_1430 = uStack_1450;
    uStack_1428 = uStack_1448;
    local_1400 = local_1420;
    uStack_13f8 = uStack_1418;
    uStack_13f0 = uStack_1410;
    uStack_13e8 = uStack_1408;
    local_1360 = local_1378;
    local_1348 = local_1378;
    local_1330 = local_1378;
    local_1318 = local_1378;
    local_1300 = local_1378;
    local_12e8 = local_1378;
    local_d40 = local_2220._0_8_;
    uStack_d38 = local_2220._8_8_;
    uStack_d30 = local_2220._16_8_;
    uStack_d28 = local_2220._24_8_;
  }
  for (; local_23cc = in_ECX, local_23dc + 3 < in_ECX; local_23dc = local_23dc + 4) {
    local_2360 = local_23b8;
    local_2470 = *(undefined8 *)*local_23b8;
    uStack_2468 = *(undefined8 *)(*local_23b8 + 8);
    local_c88 = local_23d1;
    local_c90 = &local_2470;
    local_c98 = &local_23f0;
    local_ba0 = local_2490;
    uStack_b98 = uStack_2488;
    auVar43._8_8_ = uStack_2488;
    auVar43._0_8_ = local_2490;
    auVar42._8_8_ = uStack_2488;
    auVar42._0_8_ = local_2490;
    auVar41._8_8_ = uStack_2488;
    auVar41._0_8_ = local_2490;
    auVar40._8_8_ = uStack_2488;
    auVar40._0_8_ = local_2490;
    local_8c4 = 0;
    local_8a4 = 0;
    local_8c0 = 0;
    local_bc0 = 0;
    uStack_bb8 = 0;
    local_8e4 = 0x80000000;
    local_8c8 = 0x80000000;
    local_8e0 = 0x80000000;
    local_bd0 = 0x8000000080000000;
    uStack_bc8 = 0x8000000080000000;
    local_904 = 0x40490fdb;
    local_8e8 = 0x40490fdb;
    local_900 = 0x40490fdb;
    local_be0 = 0x40490fdb40490fdb;
    uStack_bd8 = 0x40490fdb40490fdb;
    local_924 = 0x3fc90fdb;
    local_908 = 0x3fc90fdb;
    local_920 = 0x3fc90fdb;
    local_bf0 = 0x3fc90fdb3fc90fdb;
    uStack_be8 = 0x3fc90fdb3fc90fdb;
    local_c00 = vcmpps_avx(*(undefined1 (*) [16])*local_23b8,ZEXT816(0),4);
    local_c10 = vcmpps_avx(auVar40,ZEXT816(0),4);
    local_a60 = local_c00._0_8_;
    uStack_a58 = local_c00._8_8_;
    local_a70 = local_c10._0_8_;
    uStack_a68 = local_c10._8_8_;
    local_c20 = vpand_avx(local_c00,local_c10);
    auVar7._8_8_ = 0x8000000080000000;
    auVar7._0_8_ = 0x8000000080000000;
    local_c30 = vpand_avx(auVar7,*(undefined1 (*) [16])*local_23b8);
    auVar6._8_8_ = 0x8000000080000000;
    auVar6._0_8_ = 0x8000000080000000;
    local_c40 = vpand_avx(auVar6,auVar41);
    local_ae0 = vcmpps_avx(*(undefined1 (*) [16])*local_23b8,ZEXT816(0),1);
    local_ac0 = vcmpps_avx(auVar42,ZEXT816(0),1);
    auVar2._8_8_ = 0x8000000080000000;
    auVar2._0_8_ = 0x8000000080000000;
    local_9a0 = vpand_avx(local_ac0,auVar2);
    auVar10._8_8_ = 0x40490fdb40490fdb;
    auVar10._0_8_ = 0x40490fdb40490fdb;
    local_af0 = vpor_avx(local_9a0,auVar10);
    local_c50 = vpand_avx(local_ae0,local_af0);
    local_6b0 = vdivps_avx(auVar43,*(undefined1 (*) [16])*local_23b8);
    local_134 = 0x80000000;
    local_114 = 0x80000000;
    local_130 = 0x80000000;
    local_6c0 = 0x8000000080000000;
    uStack_6b8 = 0x8000000080000000;
    local_154 = 0x3f800000;
    local_138 = 0x3f800000;
    local_150 = 0x3f800000;
    local_6d0 = 0x3f8000003f800000;
    uStack_6c8 = 0x3f8000003f800000;
    local_174 = 0xbf800000;
    local_158 = 0xbf800000;
    local_170 = 0xbf800000;
    local_6e0 = 0xbf800000bf800000;
    uStack_6d8 = 0xbf800000bf800000;
    local_194 = 0x3fc90fdb;
    local_178 = 0x3fc90fdb;
    local_190 = 0x3fc90fdb;
    local_6f0 = 0x3fc90fdb3fc90fdb;
    uStack_6e8 = 0x3fc90fdb3fc90fdb;
    local_1b4 = 0x3f800000;
    local_198 = 0x3f800000;
    local_1b0 = 0x3f800000;
    local_700 = 0x3f8000003f800000;
    uStack_6f8 = 0x3f8000003f800000;
    local_1d4 = 0xbeaaaa53;
    local_1b8 = 0xbeaaaa53;
    local_1d0 = 0xbeaaaa53;
    local_710 = 0xbeaaaa53beaaaa53;
    uStack_708 = 0xbeaaaa53beaaaa53;
    local_1f4 = 0x3e4cb974;
    local_1d8 = 0x3e4cb974;
    local_1f0 = 0x3e4cb974;
    local_720 = 0x3e4cb9743e4cb974;
    uStack_718 = 0x3e4cb9743e4cb974;
    local_214 = 0xbe117200;
    local_1f8 = 0xbe117200;
    local_210 = 0xbe117200;
    local_730 = 0xbe117200be117200;
    uStack_728 = 0xbe117200be117200;
    local_234 = 0x3dd9ed24;
    local_218 = 0x3dd9ed24;
    local_230 = 0x3dd9ed24;
    local_740 = 0x3dd9ed243dd9ed24;
    uStack_738 = 0x3dd9ed243dd9ed24;
    local_254 = 0xbd99b01e;
    local_238 = 0xbd99b01e;
    local_250 = 0xbd99b01e;
    local_750 = 0xbd99b01ebd99b01e;
    uStack_748 = 0xbd99b01ebd99b01e;
    local_274 = 0x3d2edd4e;
    local_258 = 0x3d2edd4e;
    local_270 = 0x3d2edd4e;
    local_760 = 0x3d2edd4e3d2edd4e;
    uStack_758 = 0x3d2edd4e3d2edd4e;
    local_294 = 0xbc83a25c;
    local_278 = 0xbc83a25c;
    local_290 = 0xbc83a25c;
    local_770 = 0xbc83a25cbc83a25c;
    uStack_768 = 0xbc83a25cbc83a25c;
    local_2b4 = 0x3b3ac537;
    local_298 = 0x3b3ac537;
    local_2b0 = 0x3b3ac537;
    local_780 = 0x3b3ac5373b3ac537;
    uStack_778 = 0x3b3ac5373b3ac537;
    local_5a0 = local_6b0._0_8_;
    uStack_598 = local_6b0._8_8_;
    auVar31._8_8_ = 0x8000000080000000;
    auVar31._0_8_ = 0x8000000080000000;
    local_790 = vpand_avx(auVar31,local_6b0);
    local_d0 = local_6b0._0_8_;
    uStack_c8 = local_6b0._8_8_;
    auVar35._8_8_ = 0x8000000080000000;
    auVar35._0_8_ = 0x8000000080000000;
    auVar2 = vpcmpeqd_avx(auVar10,auVar10);
    local_7a0 = vpandn_avx(auVar35,local_6b0);
    local_2e0 = local_7a0._0_8_;
    uStack_2d8 = local_7a0._8_8_;
    auVar33._8_8_ = 0x3f8000003f800000;
    auVar33._0_8_ = 0x3f8000003f800000;
    local_7b0 = vcmpps_avx(auVar33,local_7a0,1);
    local_5b0 = local_7b0._0_8_;
    uStack_5a8 = local_7b0._8_8_;
    auVar30._8_8_ = 0xbf800000bf800000;
    auVar30._0_8_ = 0xbf800000bf800000;
    local_2f0 = vpand_avx(local_7b0,auVar30);
    local_e0 = local_7b0._0_8_;
    uStack_d8 = local_7b0._8_8_;
    local_f0 = local_7a0._0_8_;
    uStack_e8 = local_7a0._8_8_;
    local_300 = vpandn_avx(local_7b0,local_7a0);
    local_610 = vpor_avx(local_2f0,local_300);
    local_5d0 = local_7b0._0_8_;
    uStack_5c8 = local_7b0._8_8_;
    local_5e0 = local_7a0._0_8_;
    uStack_5d8 = local_7a0._8_8_;
    local_310 = vpand_avx(local_7b0,local_7a0);
    local_100 = local_7b0._0_8_;
    uStack_f8 = local_7b0._8_8_;
    auVar34._8_8_ = 0x3f8000003f800000;
    auVar34._0_8_ = 0x3f8000003f800000;
    local_320 = vpandn_avx(local_7b0,auVar34);
    local_620 = vpor_avx(local_310,local_320);
    local_7c0 = vdivps_avx(local_610,local_620);
    local_640 = local_7c0._0_8_;
    uStack_638 = local_7c0._8_8_;
    local_630._0_4_ = local_7c0._0_4_;
    local_630._4_4_ = local_7c0._4_4_;
    uStack_628._0_4_ = local_7c0._8_4_;
    uStack_628._4_4_ = local_7c0._12_4_;
    local_7d0 = (float)local_630 * (float)local_630;
    fStack_7cc = local_630._4_4_ * local_630._4_4_;
    fStack_7c8 = (float)uStack_628 * (float)uStack_628;
    fStack_7c4 = uStack_628._4_4_ * uStack_628._4_4_;
    local_660 = CONCAT44(fStack_7cc,local_7d0);
    uStack_658 = CONCAT44(fStack_7c4,fStack_7c8);
    local_7e0 = local_7d0 * local_7d0;
    fStack_7dc = fStack_7cc * fStack_7cc;
    fStack_7d8 = fStack_7c8 * fStack_7c8;
    fStack_7d4 = fStack_7c4 * fStack_7c4;
    local_558 = &local_7e0;
    local_4d0 = &local_770;
    local_4d8 = &local_750;
    local_4a0 = CONCAT44(fStack_7dc,local_7e0);
    uStack_498 = CONCAT44(fStack_7d4,fStack_7d8);
    auVar61._4_4_ = fStack_7dc;
    auVar61._0_4_ = local_7e0;
    auVar61._8_4_ = fStack_7d8;
    auVar61._12_4_ = fStack_7d4;
    local_4b0 = 0xbc83a25cbc83a25c;
    uStack_4a8 = 0xbc83a25cbc83a25c;
    auVar70._8_8_ = 0xbc83a25cbc83a25c;
    auVar70._0_8_ = 0xbc83a25cbc83a25c;
    local_4c0 = 0xbd99b01ebd99b01e;
    uStack_4b8 = 0xbd99b01ebd99b01e;
    auVar72._8_8_ = 0xbd99b01ebd99b01e;
    auVar72._0_8_ = 0xbd99b01ebd99b01e;
    local_820 = vfmadd213ps_fma(auVar70,auVar61,auVar72);
    local_4e8 = local_820;
    local_4f0 = &local_730;
    local_470 = CONCAT44(fStack_7dc,local_7e0);
    uStack_468 = CONCAT44(fStack_7d4,fStack_7d8);
    auVar62._4_4_ = fStack_7dc;
    auVar62._0_4_ = local_7e0;
    auVar62._8_4_ = fStack_7d8;
    auVar62._12_4_ = fStack_7d4;
    local_480 = local_820._0_8_;
    uStack_478 = local_820._8_8_;
    local_490 = 0xbe117200be117200;
    uStack_488 = 0xbe117200be117200;
    auVar74._8_8_ = 0xbe117200be117200;
    auVar74._0_8_ = 0xbe117200be117200;
    local_810 = vfmadd213ps_fma(local_820,auVar62,auVar74);
    local_500 = local_810;
    local_508 = &local_710;
    local_440 = CONCAT44(fStack_7dc,local_7e0);
    uStack_438 = CONCAT44(fStack_7d4,fStack_7d8);
    auVar63._4_4_ = fStack_7dc;
    auVar63._0_4_ = local_7e0;
    auVar63._8_4_ = fStack_7d8;
    auVar63._12_4_ = fStack_7d4;
    local_450 = local_810._0_8_;
    uStack_448 = local_810._8_8_;
    local_460 = 0xbeaaaa53beaaaa53;
    uStack_458 = 0xbeaaaa53beaaaa53;
    auVar76._8_8_ = 0xbeaaaa53beaaaa53;
    auVar76._0_8_ = 0xbeaaaa53beaaaa53;
    local_800 = vfmadd213ps_fma(local_810,auVar63,auVar76);
    local_518 = &local_780;
    local_520 = &local_760;
    local_410 = CONCAT44(fStack_7dc,local_7e0);
    uStack_408 = CONCAT44(fStack_7d4,fStack_7d8);
    auVar64._4_4_ = fStack_7dc;
    auVar64._0_4_ = local_7e0;
    auVar64._8_4_ = fStack_7d8;
    auVar64._12_4_ = fStack_7d4;
    local_420 = 0x3b3ac5373b3ac537;
    uStack_418 = 0x3b3ac5373b3ac537;
    auVar69._8_8_ = 0x3b3ac5373b3ac537;
    auVar69._0_8_ = 0x3b3ac5373b3ac537;
    local_430 = 0x3d2edd4e3d2edd4e;
    uStack_428 = 0x3d2edd4e3d2edd4e;
    auVar71._8_8_ = 0x3d2edd4e3d2edd4e;
    auVar71._0_8_ = 0x3d2edd4e3d2edd4e;
    local_860 = vfmadd213ps_fma(auVar69,auVar64,auVar71);
    local_530 = local_860;
    local_538 = &local_740;
    local_3e0 = CONCAT44(fStack_7dc,local_7e0);
    uStack_3d8 = CONCAT44(fStack_7d4,fStack_7d8);
    auVar65._4_4_ = fStack_7dc;
    auVar65._0_4_ = local_7e0;
    auVar65._8_4_ = fStack_7d8;
    auVar65._12_4_ = fStack_7d4;
    local_3f0 = local_860._0_8_;
    uStack_3e8 = local_860._8_8_;
    local_400 = 0x3dd9ed243dd9ed24;
    uStack_3f8 = 0x3dd9ed243dd9ed24;
    auVar73._8_8_ = 0x3dd9ed243dd9ed24;
    auVar73._0_8_ = 0x3dd9ed243dd9ed24;
    local_850 = vfmadd213ps_fma(local_860,auVar65,auVar73);
    local_548 = local_850;
    local_550 = &local_720;
    local_3b0 = CONCAT44(fStack_7dc,local_7e0);
    uStack_3a8 = CONCAT44(fStack_7d4,fStack_7d8);
    auVar66._4_4_ = fStack_7dc;
    auVar66._0_4_ = local_7e0;
    auVar66._8_4_ = fStack_7d8;
    auVar66._12_4_ = fStack_7d4;
    local_3c0 = local_850._0_8_;
    uStack_3b8 = local_850._8_8_;
    local_3d0 = 0x3e4cb9743e4cb974;
    uStack_3c8 = 0x3e4cb9743e4cb974;
    auVar75._8_8_ = 0x3e4cb9743e4cb974;
    auVar75._0_8_ = 0x3e4cb9743e4cb974;
    local_840 = vfmadd213ps_fma(local_850,auVar66,auVar75);
    local_560 = local_840;
    local_568 = &local_700;
    local_380 = CONCAT44(fStack_7dc,local_7e0);
    uStack_378 = CONCAT44(fStack_7d4,fStack_7d8);
    auVar67._4_4_ = fStack_7dc;
    auVar67._0_4_ = local_7e0;
    auVar67._8_4_ = fStack_7d8;
    auVar67._12_4_ = fStack_7d4;
    local_390 = local_840._0_8_;
    uStack_388 = local_840._8_8_;
    local_3a0 = 0x3f8000003f800000;
    uStack_398 = 0x3f8000003f800000;
    auVar77._8_8_ = 0x3f8000003f800000;
    auVar77._0_8_ = 0x3f8000003f800000;
    local_830 = vfmadd213ps_fma(local_840,auVar67,auVar77);
    local_570 = &local_7d0;
    local_578 = local_800;
    local_580 = local_830;
    local_350 = CONCAT44(fStack_7cc,local_7d0);
    uStack_348 = CONCAT44(fStack_7c4,fStack_7c8);
    auVar68._4_4_ = fStack_7cc;
    auVar68._0_4_ = local_7d0;
    auVar68._8_4_ = fStack_7c8;
    auVar68._12_4_ = fStack_7c4;
    local_360 = local_800._0_8_;
    uStack_358 = local_800._8_8_;
    local_370 = local_830._0_8_;
    uStack_368 = local_830._8_8_;
    local_7f0 = vfmadd213ps_fma(local_800,auVar68,local_830);
    local_680 = local_7c0._0_8_;
    uStack_678 = local_7c0._8_8_;
    local_670._0_4_ = local_7f0._0_4_;
    local_670._4_4_ = local_7f0._4_4_;
    uStack_668._0_4_ = local_7f0._8_4_;
    uStack_668._4_4_ = local_7f0._12_4_;
    local_690 = (float)local_670 * (float)local_630;
    fStack_68c = local_670._4_4_ * local_630._4_4_;
    fStack_688 = (float)uStack_668 * (float)uStack_628;
    fStack_684 = uStack_668._4_4_ * uStack_628._4_4_;
    local_5f0 = local_7b0._0_8_;
    uStack_5e8 = local_7b0._8_8_;
    auVar29._8_8_ = 0x3fc90fdb3fc90fdb;
    auVar29._0_8_ = 0x3fc90fdb3fc90fdb;
    _local_6a0 = vpand_avx(local_7b0,auVar29);
    local_330 = local_690 + (float)local_6a0._0_4_;
    fStack_32c = fStack_68c + (float)local_6a0._4_4_;
    fStack_328 = fStack_688 + fStack_698;
    fStack_324 = fStack_684 + fStack_694;
    local_340 = local_790._0_8_;
    uStack_338 = local_790._8_8_;
    auVar32._4_4_ = fStack_32c;
    auVar32._0_4_ = local_330;
    auVar32._8_4_ = fStack_328;
    auVar32._12_4_ = fStack_324;
    _local_b80 = vpor_avx(auVar32,local_790);
    local_b90._0_4_ = local_c50._0_4_;
    local_b90._4_4_ = local_c50._4_4_;
    uStack_b88._0_4_ = local_c50._8_4_;
    uStack_b88._4_4_ = local_c50._12_4_;
    local_c60 = (float)local_b80._0_4_ + (float)local_b90;
    fStack_c5c = (float)local_b80._4_4_ + local_b90._4_4_;
    fStack_c58 = fStack_b78 + (float)uStack_b88;
    fStack_c54 = fStack_b74 + uStack_b88._4_4_;
    local_9c0 = local_c30._0_8_;
    uStack_9b8 = local_c30._8_8_;
    auVar9._8_8_ = 0x40490fdb40490fdb;
    auVar9._0_8_ = 0x40490fdb40490fdb;
    local_980 = vpor_avx(local_c30,auVar9);
    local_c70 = vcmpps_avx(local_980,ZEXT816(0),1);
    local_b00 = local_c10._0_8_;
    uStack_af8 = local_c10._8_8_;
    local_9e0 = local_c40._0_8_;
    uStack_9d8 = local_c40._8_8_;
    auVar8._8_8_ = 0x3fc90fdb3fc90fdb;
    auVar8._0_8_ = 0x3fc90fdb3fc90fdb;
    local_b10 = vpor_avx(local_c40,auVar8);
    local_a20 = vpand_avx(local_c10,local_b10);
    local_80 = local_c10._0_8_;
    uStack_78 = local_c10._8_8_;
    local_b20 = local_c70._0_8_;
    uStack_b18 = local_c70._8_8_;
    auVar5._8_8_ = 0x40490fdb40490fdb;
    auVar5._0_8_ = 0x40490fdb40490fdb;
    local_a00 = vpand_avx(local_c70,auVar5);
    local_60 = local_c70._0_8_;
    uStack_58 = local_c70._8_8_;
    local_a10 = vpandn_avx(local_c70,ZEXT816(0));
    local_90 = vpor_avx(local_a00,local_a10);
    local_a30 = vpandn_avx(local_c10,local_90);
    local_c80 = vpor_avx(local_a20,local_a30);
    local_b40 = local_c20._0_8_;
    uStack_b38 = local_c20._8_8_;
    local_b50 = CONCAT44(fStack_c5c,local_c60);
    uStack_b48 = CONCAT44(fStack_c54,fStack_c58);
    auVar4._8_8_ = uStack_b48;
    auVar4._0_8_ = local_b50;
    local_a40 = vpand_avx(local_c20,auVar4);
    local_a0 = local_c20._0_8_;
    uStack_98 = local_c20._8_8_;
    local_b0 = local_c80._0_8_;
    uStack_a8 = local_c80._8_8_;
    local_a50 = vpand_avx(local_c20 ^ auVar2,local_c80);
    auVar2 = vpor_avx(local_a40,local_a50);
    local_2338 = local_23c8;
    local_2480 = auVar2._0_8_;
    local_2350 = local_2480;
    uStack_2478 = auVar2._8_8_;
    uStack_2348 = uStack_2478;
    *(undefined8 *)local_23c8 = local_2480;
    *(undefined8 *)(local_23c8 + 2) = uStack_2478;
    local_23b8 = (undefined1 (*) [32])(*local_23b8 + 0x10);
    local_23c8 = local_23c8 + 4;
    local_bb0 = local_2470;
    uStack_ba8 = uStack_2468;
    local_b90 = local_c50._0_8_;
    uStack_b88 = local_c50._8_8_;
    local_b70 = local_2470;
    uStack_b68 = uStack_2468;
    local_b60 = local_ba0;
    uStack_b58 = uStack_b98;
    local_b30 = local_be0;
    uStack_b28 = uStack_bd8;
    local_ad0 = local_bd0;
    uStack_ac8 = uStack_bc8;
    local_ab0 = local_ba0;
    uStack_aa8 = uStack_b98;
    local_aa0 = local_bd0;
    uStack_a98 = uStack_bc8;
    local_a90 = local_2470;
    uStack_a88 = uStack_2468;
    local_a80 = local_bd0;
    uStack_a78 = uStack_bc8;
    local_9f0 = local_bf0;
    uStack_9e8 = uStack_be8;
    local_9d0 = local_be0;
    uStack_9c8 = uStack_bd8;
    local_9b0 = local_be0;
    uStack_9a8 = uStack_bd8;
    local_990 = local_bc0;
    uStack_988 = uStack_bb8;
    local_970 = local_bc0;
    uStack_968 = uStack_bb8;
    local_960 = local_ba0;
    uStack_958 = uStack_b98;
    local_950 = local_bc0;
    uStack_948 = uStack_bb8;
    local_940 = local_2470;
    uStack_938 = uStack_2468;
    uStack_91c = local_920;
    uStack_918 = local_920;
    uStack_914 = local_920;
    uStack_8fc = local_900;
    uStack_8f8 = local_900;
    uStack_8f4 = local_900;
    uStack_8dc = local_8e0;
    uStack_8d8 = local_8e0;
    uStack_8d4 = local_8e0;
    uStack_8bc = local_8c0;
    uStack_8b8 = local_8c0;
    uStack_8b4 = local_8c0;
    local_8a0 = local_bc0;
    uStack_898 = uStack_bb8;
    local_890 = local_ba0;
    uStack_888 = uStack_b98;
    local_880 = local_bc0;
    uStack_878 = uStack_bb8;
    local_870 = local_2470;
    uStack_868 = uStack_2468;
    local_670 = local_7f0._0_8_;
    uStack_668 = local_7f0._8_8_;
    local_650 = local_660;
    uStack_648 = uStack_658;
    local_630 = local_640;
    uStack_628 = uStack_638;
    local_600 = local_6f0;
    uStack_5f8 = uStack_6e8;
    local_5c0 = local_6e0;
    uStack_5b8 = uStack_6d8;
    local_590 = local_6c0;
    uStack_588 = uStack_6b8;
    local_540 = local_558;
    local_528 = local_558;
    local_510 = local_558;
    local_4f8 = local_558;
    local_4e0 = local_558;
    local_4c8 = local_558;
    local_2d0 = local_6d0;
    uStack_2c8 = uStack_6c8;
    uStack_2ac = local_2b0;
    uStack_2a8 = local_2b0;
    uStack_2a4 = local_2b0;
    uStack_28c = local_290;
    uStack_288 = local_290;
    uStack_284 = local_290;
    uStack_26c = local_270;
    uStack_268 = local_270;
    uStack_264 = local_270;
    uStack_24c = local_250;
    uStack_248 = local_250;
    uStack_244 = local_250;
    uStack_22c = local_230;
    uStack_228 = local_230;
    uStack_224 = local_230;
    uStack_20c = local_210;
    uStack_208 = local_210;
    uStack_204 = local_210;
    uStack_1ec = local_1f0;
    uStack_1e8 = local_1f0;
    uStack_1e4 = local_1f0;
    uStack_1cc = local_1d0;
    uStack_1c8 = local_1d0;
    uStack_1c4 = local_1d0;
    uStack_1ac = local_1b0;
    uStack_1a8 = local_1b0;
    uStack_1a4 = local_1b0;
    uStack_18c = local_190;
    uStack_188 = local_190;
    uStack_184 = local_190;
    uStack_16c = local_170;
    uStack_168 = local_170;
    uStack_164 = local_170;
    uStack_14c = local_150;
    uStack_148 = local_150;
    uStack_144 = local_150;
    uStack_12c = local_130;
    uStack_128 = local_130;
    uStack_124 = local_130;
    local_110 = local_6d0;
    uStack_108 = uStack_6c8;
    local_c0 = local_6c0;
    uStack_b8 = uStack_6b8;
    local_70 = local_bc0;
    uStack_68 = uStack_bb8;
  }
  for (; local_23dc < local_23cc; local_23dc = local_23dc + 1) {
    local_38 = local_23d1;
    local_40 = local_23b8;
    local_48 = &local_23d8;
    fVar78 = atan2f(local_23d8,*(float *)*local_23b8);
    *local_23c8 = fVar78;
    local_23b8 = (undefined1 (*) [32])(*local_23b8 + 4);
    local_23c8 = local_23c8 + 1;
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_b(const float* ptr, const float* ptr1, float* outptr, int size, int elempack)
{
    const Op op;

    const float b = *ptr1;

    int i = 0;
#if __SSE2__
    __m128 _b_128 = (elempack == 4) ? _mm_loadu_ps(ptr1) : _mm_set1_ps(b);
#if __AVX__
    __m256 _b_256 = (elempack == 8) ? _mm256_loadu_ps(ptr1) : _mm256_insertf128_ps(_mm256_castps128_ps256(_b_128), _b_128, 1);
#if __AVX512F__
    __m512 _b_512 = (elempack == 16) ? _mm512_loadu_ps(ptr1) : _mm512_insertf32x8(_mm512_castps256_ps512(_b_256), _b_256, 1);
    for (; i + 15 < size; i += 16)
    {
        __m512 _p = _mm512_loadu_ps(ptr);
        __m512 _outp = op.func_pack16(_p, _b_512);
        _mm512_storeu_ps(outptr, _outp);
        ptr += 16;
        outptr += 16;
    }
#endif // __AVX512F__
    for (; i + 7 < size; i += 8)
    {
        __m256 _p = _mm256_loadu_ps(ptr);
        __m256 _outp = op.func_pack8(_p, _b_256);
        _mm256_storeu_ps(outptr, _outp);
        ptr += 8;
        outptr += 8;
    }
#endif // __AVX__
    for (; i + 3 < size; i += 4)
    {
        __m128 _p = _mm_loadu_ps(ptr);
        __m128 _outp = op.func_pack4(_p, _b_128);
        _mm_storeu_ps(outptr, _outp);
        ptr += 4;
        outptr += 4;
    }
#endif // __SSE2__
    for (; i < size; i++)
    {
        *outptr = op.func(*ptr, b);
        ptr += 1;
        outptr += 1;
    }
}